

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

ssize_t __thiscall Reader::read(Reader *this,int __fd,void *__buf,size_t __nbytes)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  invalid_argument *this_00;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  undefined4 in_register_00000034;
  Reader *this_01;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  size_t i;
  long lVar8;
  
  this_01 = (Reader *)CONCAT44(in_register_00000034,__fd);
  this_01->linebufferpos = 0;
  lVar8 = 0;
  do {
    do {
      bVar3 = readnexttoken(this_01,(this_01->rawtokens)._M_elems + lVar8);
    } while (!bVar3);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  processtokens(this_01);
  (this_01->linebuffer)._M_string_length = 0;
  *(this_01->linebuffer)._M_dataplus._M_p = '\0';
  std::__cxx11::string::reserve();
  splittokens(this_01);
  p_Var1 = &(this_01->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this_01->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = p_Var4;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < 1]) {
    if (0 < (int)p_Var7[1]._M_color) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, 1 < (int)p_Var6[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < 2]) {
    if (1 < (int)p_Var4[1]._M_color) {
      p_Var7 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var4 = p_Var7, 2 < (int)p_Var7[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)p_Var5 == p_Var1) && ((_Rb_tree_header *)p_Var4 == p_Var1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"File not existent or illegal file format.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  processsections(this_01);
  std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>::_M_erase_at_end
            (&this_01->processedtokens,
             (this_01->processedtokens).
             super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
             super__Vector_impl_data._M_start);
  (this->file).super_istream._vptr_basic_istream =
       (_func_int **)
       (this_01->builder).model.objective.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  p_Var2 = (this_01->builder).model.objective.
           super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->file).super_istream._M_gcount = (streamsize)p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  *(ObjectiveSense *)&(this->file).super_istream.field_0x10 = (this_01->builder).model.sense;
  std::vector<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>::vector
            ((vector<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_> *)
             &(this->file).super_istream.field_0x18,&(this_01->builder).model.constraints);
  std::vector<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>::vector
            ((vector<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_> *)
             &(this->file).super_istream.field_0x30,&(this_01->builder).model.variables);
  std::vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>::vector
            ((vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_> *)
             &(this->file).super_istream.field_0x48,&(this_01->builder).model.soss);
  return (ssize_t)this;
}

Assistant:

Model Reader::read() {
  // std::clog << "Reading input, tokenizing..." << std::endl;
  this->linebufferpos = 0;
  // read first NRAWTOKEN token
  // if file ends early, then all remaining tokens are set to FLEND
  for (size_t i = 0; i < NRAWTOKEN; ++i)
    while (!readnexttoken(rawtokens[i]))
      ;

  processtokens();

  linebuffer.clear();
  linebuffer.shrink_to_fit();

  // std::clog << "Splitting tokens..." << std::endl;
  splittokens();

  // std::clog << "Setting up model..." << std::endl;
  //
  // Since
  //
  // "The problem statement must begin with the word MINIMIZE or
  // MAXIMIZE, MINIMUM or MAXIMUM, or the abbreviations MIN or MAX, in
  // any combination of upper- and lower-case characters. The word
  // introduces the objective function section."
  //
  // Use positivity of sectiontokens.count(LpSectionKeyword::OBJMIN) +
  // sectiontokens.count(LpSectionKeyword::OBJMAX) to identify garbage file
  //

  const int num_objective_section =
    sectiontokens.count(LpSectionKeyword::OBJMIN) +
    sectiontokens.count(LpSectionKeyword::OBJMAX);
  lpassert(num_objective_section>0);

  processsections();
  processedtokens.clear();
  processedtokens.shrink_to_fit();

  return builder.model;
}